

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O0

FT_Error tt_cmap14_init(TT_CMap14 cmap,FT_Byte *table)

{
  FT_Byte *table_local;
  TT_CMap14 cmap_local;
  
  (cmap->cmap).data = table;
  cmap->num_selectors =
       (ulong)((uint)table[6] << 0x18 | (uint)table[7] << 0x10 | (uint)table[8] << 8 |
              (uint)table[9]);
  cmap->max_results = 0;
  cmap->results = (FT_UInt32 *)0x0;
  return 0;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  tt_cmap14_init( TT_CMap14  cmap,
                  FT_Byte*   table )
  {
    cmap->cmap.data = table;

    table               += 6;
    cmap->num_selectors  = FT_PEEK_ULONG( table );
    cmap->max_results    = 0;
    cmap->results        = NULL;

    return FT_Err_Ok;
  }